

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O1

void __thiscall helics::udp::UdpComms::queue_rx_function(UdpComms *this)

{
  GlobalFederateId *pGVar1;
  io_context *owner;
  undefined1 *puVar2;
  int32_t iVar3;
  ushort uVar4;
  int iVar5;
  int *__s;
  size_t sVar6;
  executor_type *peVar7;
  int __oflag;
  sockaddr *__addr;
  value_type *__val;
  string_view message;
  string local_298;
  _Any_data *local_278;
  string *local_260;
  error_code error;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  ActionMessage cmd;
  error_code ignored_error;
  endpoint remote_endp;
  ActionMessage reply;
  socket socket;
  
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar5 = std::future<int>::get(&this->futurePort);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar5;
    UNLOCK();
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  pGVar1 = &cmd.dest_id;
  cmd.messageAction._0_2_ = SUB82(pGVar1,0);
  cmd.messageAction._2_2_ = (undefined2)((ulong)pGVar1 >> 0x10);
  cmd.messageID = (int32_t)((ulong)pGVar1 >> 0x20);
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  cmd.dest_id.gid = cmd.dest_id.gid & 0xffffff00;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&cmd);
  puVar2 = (undefined1 *)
           CONCAT44(cmd.messageID,CONCAT22(cmd.messageAction._2_2_,(undefined2)cmd.messageAction));
  if ((GlobalFederateId *)puVar2 != pGVar1) {
    operator_delete(puVar2,CONCAT44(cmd.dest_handle.hid,cmd.dest_id.gid) + 1);
  }
  owner = ((ioctx.
            super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->ictx)._M_t.
          super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
          super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
          super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  cmd.messageAction._0_2_ = 0x3dd8;
  cmd.messageAction._2_2_ = 0x4e;
  cmd.messageID = 0;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_ =
       (service_type *)
       asio::detail::service_registry::do_use_service
                 ((owner->super_execution_context).service_registry_,(key *)&cmd,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::udp>,asio::io_context>,
                  owner);
  peVar7 = &socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.protocol_.
  family_ = 2;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
       ::fns_with_execute;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
       ::fns;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)asio::execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::
                  prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                  ::fns;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = -1;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  cmd.messageAction =
       (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) * 8
       + cmd_user_disconnect;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_.data._0_8_ = owner;
  socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ = peVar7;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&cmd,__oflag);
  local_260 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  local_278 = (_Any_data *)0x0;
  uVar4 = (ushort)(this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
  cmd.messageAction._2_2_ = uVar4 << 8 | uVar4 >> 8;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) {
    cmd.messageAction._0_2_ = cmd_init;
  }
  else {
    cmd.messageAction._0_2_ = cmd_user_disconnect;
  }
  cmd.source_handle.hid = 0;
  cmd.source_id.gid = 0;
  cmd.messageID = 0;
  cmd.counter = 0;
  cmd.flags = 0;
  cmd.dest_handle.hid = 0;
  cmd.dest_id.gid = 0;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            (&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&cmd,__addr,
             (socklen_t)peVar7);
  __s = (int *)operator_new(0x27d0);
  memset(__s,0,0x27d0);
  remote_endp.impl_.data_._8_4_ = 0;
  remote_endp.impl_.data_._12_4_ = 0;
  remote_endp.impl_.data_._16_4_ = 0;
  remote_endp.impl_.data_._20_8_ = 0;
  remote_endp.impl_.data_._0_8_ = 2;
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  ignored_error._M_value = 0;
  ignored_error._M_cat = error._M_cat;
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  local_278 = (_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback;
  do {
    cmd.messageAction._0_2_ = SUB82(__s,0);
    cmd.messageAction._2_2_ = (undefined2)((ulong)__s >> 0x10);
    cmd.messageID = (int32_t)((ulong)__s >> 0x20);
    cmd.source_id.gid = 0x27d0;
    cmd.source_handle.hid = 0;
    sVar6 = asio::detail::reactive_socket_service<asio::ip::udp>::
            receive_from<asio::mutable_buffers_1>
                      (socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                       service_,&socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.
                                 impl_.implementation_,(mutable_buffers_1 *)&cmd,&remote_endp,0,
                       &error);
    if (error._M_value == 0) {
      if ((sVar6 == 5) && ((char)__s[1] == 'e' && *__s == 0x736f6c63)) {
        iVar5 = 7;
      }
      else {
        ActionMessage::ActionMessage(&cmd,__s,sVar6);
        iVar5 = CONCAT22(cmd.messageAction._2_2_,(undefined2)cmd.messageAction);
        if (iVar5 < 0xf69b5) {
          if ((iVar5 == -60000) || (iVar5 == 60000)) {
LAB_00262ee9:
            iVar5 = 7;
            if (cmd.messageID != 0x16570bf) {
              NetworkCommsInterface::generateReplyToIncomingMessage
                        (&reply,&this->super_NetworkCommsInterface,&cmd);
              iVar3 = reply.messageID;
              iVar5 = 7;
              if ((reply.messageID != 0x9db) && (iVar5 = 0, reply.messageAction != cmd_ignore)) {
                ActionMessage::to_string_abi_cxx11_(&local_298,&reply);
                sVar6 = 0x1c;
                if (remote_endp.impl_.data_.base.sa_family == 2) {
                  sVar6 = 0x10;
                }
                asio::detail::socket_ops::sync_sendto1
                          (socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                           implementation_.super_base_implementation_type.socket_,
                           socket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.
                           implementation_.super_base_implementation_type.state_,
                           local_298._M_dataplus._M_p,local_298._M_string_length,0,&remote_endp,
                           sVar6,&ignored_error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_dataplus._M_p != &local_298.field_2) {
                  operator_delete(local_298._M_dataplus._M_p,
                                  local_298.field_2._M_allocated_capacity + 1);
                }
              }
              ActionMessage::~ActionMessage(&reply);
              if (iVar3 != 0x9db) goto LAB_00262fed;
            }
          }
          else {
LAB_00262fd1:
            if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.
                super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
                      (local_278,&cmd);
LAB_00262fed:
            iVar5 = 0;
          }
        }
        else {
          if (iVar5 == 0x1000ea60) goto LAB_00262ee9;
          if (iVar5 != 0xf69b5) goto LAB_00262fd1;
          iVar5 = 6;
          message._M_str = "invalid command received udp";
          message._M_len = 0x1c;
          CommsInterface::logWarning((CommsInterface *)this,message);
        }
        ActionMessage::~ActionMessage(&cmd);
      }
    }
    else {
      iVar5 = 1;
      CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    }
    if ((iVar5 != 0) && (iVar5 != 6)) {
      if (iVar5 == 7) {
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
      }
      operator_delete(__s,0x27d0);
      asio::detail::
      io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
      ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                       *)&socket);
      if (ioctx.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (ioctx.
                   super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
  } while( true );
}

Assistant:

void UdpComms::queue_rx_function()
{
    using gmlc::networking::makePortAddress;

    if (PortNumber < 0) {
        PortNumber = futurePort.get();
    }
    if (PortNumber < 0) {
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::socket socket(ioctx->getBaseContext());
    socket.open(udpnet(interfaceNetwork));
    std::chrono::milliseconds t_cnt{0};
    bool bindsuccess = false;
    while (!bindsuccess) {
        try {
            socket.bind(udp::endpoint(udpnet(interfaceNetwork), static_cast<uint16_t>(PortNumber)));
            bindsuccess = true;
        }
        catch (const std::system_error& error) {
            if ((autoPortNumber) &&
                (hasBroker)) {  // If we failed and we are on an automatically assigned port
                                // number,  just try a different port
                int tries = 0;
                while (!bindsuccess) {
                    ++PortNumber;
                    try {
                        socket.bind(udp::endpoint(udpnet(interfaceNetwork),
                                                  static_cast<uint16_t>(PortNumber)));
                        bindsuccess = true;
                    }
                    catch (const std::system_error&) {
                        ++tries;
                        if (tries > 10) {
                            break;
                        }
                    }
                }
                if (!bindsuccess) {
                    disconnecting = true;
                    logError(fmt::format("unable to bind socket {} :{}",
                                         makePortAddress(localTargetAddress, PortNumber),
                                         error.what()));
                    socket.close();
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
                continue;
            }
            if (t_cnt == std::chrono::milliseconds(0)) {
                logWarning(fmt::format("bind error on UDP socket {} :{}",
                                       makePortAddress(localTargetAddress, PortNumber),
                                       error.what()));
            }
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            t_cnt += std::chrono::milliseconds(200);
            if (t_cnt > connectionTimeout) {
                disconnecting = true;
                logError(fmt::format("unable to bind socket {} :{}",
                                     makePortAddress(localTargetAddress, PortNumber),
                                     error.what()));
                socket.close();
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    std::vector<char> data(10192);
    udp::endpoint remote_endp;
    std::error_code error;
    std::error_code ignored_error;
    setRxStatus(ConnectionStatus::CONNECTED);
    while (true) {
        auto len = socket.receive_from(asio::buffer(data), remote_endp, 0, error);
        if (error) {
            setRxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (len == 5) {
            const std::string_view str(data.data(), len);
            if (str == "close") {
                break;
            }
        }
        ActionMessage cmd(reinterpret_cast<std::byte*>(data.data()), len);
        if (!isValidCommand(cmd)) {
            logWarning("invalid command received udp");
            continue;
        }
        if (isProtocolCommand(cmd)) {
            if (cmd.messageID == CLOSE_RECEIVER) {
                break;
            }
            auto reply = generateReplyToIncomingMessage(cmd);
            if (reply.messageID == DISCONNECT) {
                break;
            }
            if (reply.action() != CMD_IGNORE) {
                socket.send_to(asio::buffer(reply.to_string()), remote_endp, 0, ignored_error);
            }
        } else {
            ActionCallback(std::move(cmd));
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}